

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void walMergesort(u32 *aContent,ht_slot *aBuffer,ht_slot *aList,int *pnList)

{
  Sublist *p_1;
  Sublist *p;
  Sublist aSub [13];
  uint local_40;
  uint local_3c;
  u32 iSub;
  int iList;
  ht_slot *aMerge;
  int nMerge;
  int nList;
  int *pnList_local;
  ht_slot *aList_local;
  ht_slot *aBuffer_local;
  u32 *aContent_local;
  
  aMerge._4_4_ = *pnList;
  aMerge._0_4_ = 0;
  _iSub = (ht_slot *)0x0;
  local_40 = 0;
  _nMerge = pnList;
  pnList_local = (int *)aList;
  aList_local = aBuffer;
  aBuffer_local = (ht_slot *)aContent;
  memset(&p,0,0xd0);
  for (local_3c = 0; (int)local_3c < (int)aMerge._4_4_; local_3c = local_3c + 1) {
    aMerge._0_4_ = 1;
    _iSub = (ht_slot *)((long)pnList_local + (long)(int)local_3c * 2);
    local_40 = 0;
    while ((local_3c & 1 << ((byte)local_40 & 0x1f)) != 0) {
      walMerge((u32 *)aBuffer_local,*(ht_slot **)(aSub + local_40),
               *(int *)&aSub[(ulong)local_40 - 1].aList,(ht_slot **)&iSub,(int *)&aMerge,aList_local
              );
      local_40 = local_40 + 1;
    }
    *(ht_slot **)(aSub + local_40) = _iSub;
    *(int *)&aSub[(ulong)local_40 - 1].aList = (int)aMerge;
  }
  while (local_40 = local_40 + 1, local_40 < 0xd) {
    if ((aMerge._4_4_ & 1 << ((byte)local_40 & 0x1f)) != 0) {
      walMerge((u32 *)aBuffer_local,*(ht_slot **)(aSub + local_40),
               *(int *)&aSub[(ulong)local_40 - 1].aList,(ht_slot **)&iSub,(int *)&aMerge,aList_local
              );
    }
  }
  *_nMerge = (int)aMerge;
  return;
}

Assistant:

static void walMergesort(
  const u32 *aContent,            /* Pages in wal */
  ht_slot *aBuffer,               /* Buffer of at least *pnList items to use */
  ht_slot *aList,                 /* IN/OUT: List to sort */
  int *pnList                     /* IN/OUT: Number of elements in aList[] */
){
  struct Sublist {
    int nList;                    /* Number of elements in aList */
    ht_slot *aList;               /* Pointer to sub-list content */
  };

  const int nList = *pnList;      /* Size of input list */
  int nMerge = 0;                 /* Number of elements in list aMerge */
  ht_slot *aMerge = 0;            /* List to be merged */
  int iList;                      /* Index into input list */
  u32 iSub = 0;                   /* Index into aSub array */
  struct Sublist aSub[13];        /* Array of sub-lists */

  memset(aSub, 0, sizeof(aSub));
  assert( nList<=HASHTABLE_NPAGE && nList>0 );
  assert( HASHTABLE_NPAGE==(1<<(ArraySize(aSub)-1)) );

  for(iList=0; iList<nList; iList++){
    nMerge = 1;
    aMerge = &aList[iList];
    for(iSub=0; iList & (1<<iSub); iSub++){
      struct Sublist *p;
      assert( iSub<ArraySize(aSub) );
      p = &aSub[iSub];
      assert( p->aList && p->nList<=(1<<iSub) );
      assert( p->aList==&aList[iList&~((2<<iSub)-1)] );
      walMerge(aContent, p->aList, p->nList, &aMerge, &nMerge, aBuffer);
    }
    aSub[iSub].aList = aMerge;
    aSub[iSub].nList = nMerge;
  }

  for(iSub++; iSub<ArraySize(aSub); iSub++){
    if( nList & (1<<iSub) ){
      struct Sublist *p;
      assert( iSub<ArraySize(aSub) );
      p = &aSub[iSub];
      assert( p->nList<=(1<<iSub) );
      assert( p->aList==&aList[nList&~((2<<iSub)-1)] );
      walMerge(aContent, p->aList, p->nList, &aMerge, &nMerge, aBuffer);
    }
  }
  assert( aMerge==aList );
  *pnList = nMerge;

#ifdef SQLITE_DEBUG
  {
    int i;
    for(i=1; i<*pnList; i++){
      assert( aContent[aList[i]] > aContent[aList[i-1]] );
    }
  }
#endif
}